

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint * create_is_false_constraint(void)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValue local_28;
  
  make_cgreen_integer_value(&local_28,0);
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  (pCVar1->expected_value).type = local_28.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_28._4_4_;
  (pCVar1->expected_value).value = local_28.value;
  (pCVar1->expected_value).value_size = local_28.value_size;
  pcVar2 = string_dup("false");
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->name = "be false";
  pCVar1->compare = compare_want_value;
  pCVar1->execute = test_want;
  pCVar1->actual_value_message = "";
  pCVar1->expected_value_message = "";
  return pCVar1;
}

Assistant:

Constraint *create_is_false_constraint(void) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_integer_value(false), "false");
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->name = "be false";
    constraint->compare = &compare_want_value;
    constraint->execute = &test_want;
    constraint->actual_value_message = "";
    constraint->expected_value_message = "";

    return constraint;
}